

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::DynamicMapField::SyncRepeatedFieldWithMapNoLock(DynamicMapField *this)

{
  code *pcVar1;
  void **ppvVar2;
  Arena *this_00;
  Rep *pRVar3;
  value_type *pvVar4;
  pointer pcVar5;
  double value;
  bool bVar6;
  int iVar7;
  uint32 uVar8;
  int32 iVar9;
  undefined4 extraout_var;
  FieldDescriptor *field;
  undefined4 extraout_var_00;
  FieldDescriptor *field_00;
  RepeatedPtrField<google::protobuf::Message> *pRVar10;
  undefined4 extraout_var_01;
  LogMessage *other;
  uint64 uVar11;
  string *psVar12;
  int64 iVar13;
  Message *pMVar14;
  Message *pMVar15;
  Reflection *this_01;
  long lVar16;
  long lVar17;
  MapValueRef *this_02;
  float value_00;
  const_iterator it;
  FieldDescriptor *local_d8;
  undefined1 local_d0 [56];
  RepeatedPtrField<google::protobuf::Message> *local_98;
  FieldDescriptor *local_90;
  iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  local_88;
  string local_70;
  string local_50;
  
  (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x15])();
  iVar7 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x15])();
  pcVar1 = (code *)(local_d0 + 0x10);
  local_d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"key","");
  field = Descriptor::FindFieldByName((Descriptor *)CONCAT44(extraout_var,iVar7),(string *)local_d0)
  ;
  if ((code *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_);
  }
  iVar7 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x15])();
  local_d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"value","");
  field_00 = Descriptor::FindFieldByName
                       ((Descriptor *)CONCAT44(extraout_var_00,iVar7),(string *)local_d0);
  if ((code *)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_);
  }
  if ((this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
      .super_MapFieldBase.repeated_field_ == (RepeatedPtrField<google::protobuf::Message> *)0x0) {
    this_00 = (this->
              super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
              ).super_MapFieldBase.arena_;
    if (this_00 == (Arena *)0x0) {
      pRVar10 = (RepeatedPtrField<google::protobuf::Message> *)operator_new(0x18);
      (pRVar10->super_RepeatedPtrFieldBase).arena_ = (Arena *)0x0;
      (pRVar10->super_RepeatedPtrFieldBase).current_size_ = 0;
      (pRVar10->super_RepeatedPtrFieldBase).total_size_ = 0;
      (pRVar10->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    }
    else {
      if (this_00->hooks_cookie_ != (void *)0x0) {
        Arena::OnArenaAllocation
                  (this_00,(type_info *)&RepeatedPtrField<google::protobuf::Message>::typeinfo,0x18)
        ;
      }
      pRVar10 = (RepeatedPtrField<google::protobuf::Message> *)
                ArenaImpl::AllocateAlignedAndAddCleanup
                          (&this_00->impl_,0x18,
                           arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                          );
      (pRVar10->super_RepeatedPtrFieldBase).arena_ = this_00;
      (pRVar10->super_RepeatedPtrFieldBase).current_size_ = 0;
      (pRVar10->super_RepeatedPtrFieldBase).total_size_ = 0;
      (pRVar10->super_RepeatedPtrFieldBase).rep_ = (Rep *)0x0;
    }
    (this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
    super_MapFieldBase.repeated_field_ = pRVar10;
  }
  pRVar10 = (this->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase.repeated_field_;
  lVar16 = (long)(pRVar10->super_RepeatedPtrFieldBase).current_size_;
  if (0 < lVar16) {
    pRVar3 = (pRVar10->super_RepeatedPtrFieldBase).rep_;
    lVar17 = 0;
    local_98 = pRVar10;
    do {
      ppvVar2 = pRVar3->elements + lVar17;
      lVar17 = lVar17 + 1;
      (**(code **)(**ppvVar2 + 0x38))();
    } while (lVar16 != lVar17);
    (local_98->super_RepeatedPtrFieldBase).current_size_ = 0;
  }
  local_d0._8_8_ = (this->map_).elements_;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
  iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
  ::SearchFrom((iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
                *)local_d0,((InnerMap *)local_d0._8_8_)->index_of_first_non_null_);
  local_90 = field_00;
  local_88.m_ = (InnerMap *)local_d0._8_8_;
  local_88.node_ = (Node *)local_d0._0_8_;
  while (local_88.node_ != (Node *)0x0) {
    iVar7 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[3])();
    pMVar15 = (Message *)CONCAT44(extraout_var_01,iVar7);
    RepeatedPtrFieldBase::
    AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
              (&((this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.repeated_field_)->super_RepeatedPtrFieldBase,pMVar15);
    pvVar4 = ((local_88.node_)->kv).v_;
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_d8 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_d0,&local_d8
                );
    }
    switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4))
    {
    case 1:
      iVar9 = MapKey::GetInt32Value(&pvVar4->first);
      Reflection::SetInt32(this_01,pMVar15,field,iVar9);
      break;
    case 2:
      iVar13 = MapKey::GetInt64Value(&pvVar4->first);
      Reflection::SetInt64(this_01,pMVar15,field,iVar13);
      break;
    case 3:
      uVar8 = MapKey::GetUInt32Value(&pvVar4->first);
      Reflection::SetUInt32(this_01,pMVar15,field,uVar8);
      break;
    case 4:
      uVar11 = MapKey::GetUInt64Value(&pvVar4->first);
      Reflection::SetUInt64(this_01,pMVar15,field,uVar11);
      break;
    case 5:
    case 6:
    case 8:
    case 10:
      LogMessage::LogMessage
                ((LogMessage *)local_d0,LOGLEVEL_FATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/map_field.cc"
                 ,0x192);
      other = LogMessage::operator<<((LogMessage *)local_d0,"Can\'t get here.");
      LogFinisher::operator=((LogFinisher *)&local_d8,other);
      LogMessage::~LogMessage((LogMessage *)local_d0);
      break;
    case 7:
      bVar6 = MapKey::GetBoolValue(&pvVar4->first);
      Reflection::SetBool(this_01,pMVar15,field,bVar6);
      break;
    case 9:
      psVar12 = MapKey::GetStringValue_abi_cxx11_(&pvVar4->first);
      pcVar5 = (psVar12->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar5,pcVar5 + psVar12->_M_string_length);
      Reflection::SetString(this_01,pMVar15,field,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    pvVar4 = ((local_88.node_)->kv).v_;
    if (*(once_flag **)(field_00 + 0x30) != (once_flag *)0x0) {
      local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_d8 = field_00;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field_00 + 0x30),(_func_void_FieldDescriptor_ptr **)local_d0,
                 &local_d8);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field_00 + 0x38) * 4) - 1U <
        10) {
      this_02 = &pvVar4->second;
      switch(*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field_00 + 0x38) * 4)) {
      case 1:
        iVar9 = MapValueRef::GetInt32Value(this_02);
        Reflection::SetInt32(this_01,pMVar15,field_00,iVar9);
        break;
      case 2:
        iVar13 = MapValueRef::GetInt64Value(this_02);
        Reflection::SetInt64(this_01,pMVar15,field_00,iVar13);
        break;
      case 3:
        uVar8 = MapValueRef::GetUInt32Value(this_02);
        Reflection::SetUInt32(this_01,pMVar15,field_00,uVar8);
        break;
      case 4:
        uVar11 = MapValueRef::GetUInt64Value(this_02);
        Reflection::SetUInt64(this_01,pMVar15,field_00,uVar11);
        break;
      case 5:
        value = MapValueRef::GetDoubleValue(this_02);
        Reflection::SetDouble(this_01,pMVar15,field_00,value);
        break;
      case 6:
        value_00 = MapValueRef::GetFloatValue(this_02);
        Reflection::SetFloat(this_01,pMVar15,field_00,value_00);
        break;
      case 7:
        bVar6 = MapValueRef::GetBoolValue(this_02);
        Reflection::SetBool(this_01,pMVar15,field_00,bVar6);
        break;
      case 8:
        iVar7 = MapValueRef::GetEnumValue(this_02);
        Reflection::SetEnumValue(this_01,pMVar15,field_00,iVar7);
        break;
      case 9:
        psVar12 = MapValueRef::GetStringValue_abi_cxx11_(this_02);
        pcVar5 = (psVar12->_M_dataplus)._M_p;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar5,pcVar5 + psVar12->_M_string_length);
        field_00 = local_90;
        Reflection::SetString(this_01,pMVar15,local_90,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
        break;
      case 10:
        pMVar14 = MapValueRef::GetMessageValue(this_02);
        pMVar15 = Reflection::MutableMessage(this_01,pMVar15,field_00,(MessageFactory *)0x0);
        (*(pMVar15->super_MessageLite)._vptr_MessageLite[0x10])(pMVar15,pMVar14);
      }
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
    ::operator++(&local_88);
  }
  return;
}

Assistant:

void DynamicMapField::SyncRepeatedFieldWithMapNoLock() const {
  const Reflection* reflection = default_entry_->GetReflection();
  const FieldDescriptor* key_des =
      default_entry_->GetDescriptor()->FindFieldByName("key");
  const FieldDescriptor* val_des =
      default_entry_->GetDescriptor()->FindFieldByName("value");
  if (MapFieldBase::repeated_field_ == NULL) {
    if (MapFieldBase::arena_ == NULL) {
      MapFieldBase::repeated_field_ = new RepeatedPtrField<Message>();
    } else {
      MapFieldBase::repeated_field_ =
          Arena::CreateMessage<RepeatedPtrField<Message> >(
              MapFieldBase::arena_);
    }
  }

  MapFieldBase::repeated_field_->Clear();

  for (Map<MapKey, MapValueRef>::const_iterator it = map_.begin();
       it != map_.end(); ++it) {
    Message* new_entry = default_entry_->New();
    MapFieldBase::repeated_field_->AddAllocated(new_entry);
    const MapKey& map_key = it->first;
    switch (key_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        reflection->SetString(new_entry, key_des, map_key.GetStringValue());
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        reflection->SetInt64(new_entry, key_des, map_key.GetInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        reflection->SetInt32(new_entry, key_des, map_key.GetInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        reflection->SetUInt64(new_entry, key_des, map_key.GetUInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        reflection->SetUInt32(new_entry, key_des, map_key.GetUInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        reflection->SetBool(new_entry, key_des, map_key.GetBoolValue());
        break;
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Can't get here.";
        break;
    }
    const MapValueRef& map_val = it->second;
    switch (val_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        reflection->SetString(new_entry, val_des, map_val.GetStringValue());
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        reflection->SetInt64(new_entry, val_des, map_val.GetInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        reflection->SetInt32(new_entry, val_des, map_val.GetInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        reflection->SetUInt64(new_entry, val_des, map_val.GetUInt64Value());
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        reflection->SetUInt32(new_entry, val_des, map_val.GetUInt32Value());
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        reflection->SetBool(new_entry, val_des, map_val.GetBoolValue());
        break;
      case FieldDescriptor::CPPTYPE_DOUBLE:
        reflection->SetDouble(new_entry, val_des, map_val.GetDoubleValue());
        break;
      case FieldDescriptor::CPPTYPE_FLOAT:
        reflection->SetFloat(new_entry, val_des, map_val.GetFloatValue());
        break;
      case FieldDescriptor::CPPTYPE_ENUM:
        reflection->SetEnumValue(new_entry, val_des, map_val.GetEnumValue());
        break;
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = map_val.GetMessageValue();
        reflection->MutableMessage(new_entry, val_des)->CopyFrom(message);
        break;
      }
    }
  }
}